

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

Image * ImageTextEx(Image *__return_storage_ptr__,Font font,char *text,float fontSize,float spacing,
                   Color tint)

{
  Rectangle dstRec;
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  size_t sVar4;
  float fVar5;
  uint local_94;
  float scaleFactor;
  Rectangle rec;
  int index;
  int codepoint;
  int codepointByteCount;
  int i;
  float fStack_30;
  Vector2 imSize;
  int textOffsetY;
  int textOffsetX;
  int length;
  float spacing_local;
  float fontSize_local;
  char *text_local;
  Color tint_local;
  
  sVar4 = strlen(text);
  imSize.y = 0.0;
  imSize.x = 0.0;
  _i = MeasureTextEx(font,text,(float)font.baseSize,spacing);
  codepointByteCount = 0;
  GenImageColor(__return_storage_ptr__,(int)(float)i,(int)fStack_30,(Color)0x0);
  for (codepoint = 0; codepoint < (int)sVar4; codepoint = index + codepoint) {
    index = 0;
    iVar2 = GetNextCodepoint(text + codepoint,&index);
    iVar3 = GetGlyphIndex(font,iVar2);
    if (iVar2 == 0x3f) {
      index = 1;
    }
    if (iVar2 == 10) {
      imSize.x = (float)(font.baseSize + font.baseSize / 2 + (int)imSize.x);
      imSize.y = 0.0;
    }
    else {
      if ((iVar2 != 0x20) && (iVar2 != 9)) {
        auVar1._4_4_ = (float)font.chars[iVar3].image.height;
        auVar1._0_4_ = (float)font.chars[iVar3].image.width;
        auVar1._8_8_ = 0;
        dstRec.y = (float)((int)imSize.x + font.chars[iVar3].offsetY);
        dstRec.x = (float)((int)imSize.y + font.chars[iVar3].offsetX);
        dstRec.width = font.recs[iVar3].width;
        dstRec.height = font.recs[iVar3].height;
        ImageDraw(__return_storage_ptr__,font.chars[iVar3].image,(Rectangle)(auVar1 << 0x40),dstRec,
                  tint);
      }
      if (font.chars[iVar3].advanceX == 0) {
        iVar2 = (int)(font.recs[iVar3].width + spacing);
      }
      else {
        iVar2 = font.chars[iVar3].advanceX + (int)spacing;
      }
      imSize.y = (float)(iVar2 + (int)imSize.y);
    }
  }
  if (fStack_30 < fontSize) {
    fVar5 = fontSize / fStack_30;
    TraceLog(3,"IMAGE: Text scaled by factor: %f",SUB84((double)fVar5,0));
    GetFontDefault();
    if (font.texture.id == local_94) {
      ImageResizeNN(__return_storage_ptr__,(int)((float)i * fVar5),(int)(fStack_30 * fVar5));
    }
    else {
      ImageResize(__return_storage_ptr__,(int)((float)i * fVar5),(int)(fStack_30 * fVar5));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Image ImageTextEx(Font font, const char *text, float fontSize, float spacing, Color tint)
{
    int length = (int)strlen(text);

    int textOffsetX = 0;            // Image drawing position X
    int textOffsetY = 0;            // Offset between lines (on line break '\n')

    // NOTE: Text image is generated at font base size, later scaled to desired font size
    Vector2 imSize = MeasureTextEx(font, text, (float)font.baseSize, spacing);

    // Create image to store text
    Image imText = GenImageColor((int)imSize.x, (int)imSize.y, BLANK);

    for (int i = 0; i < length; i++)
    {
        // Get next codepoint from byte string and glyph index in font
        int codepointByteCount = 0;
        int codepoint = GetNextCodepoint(&text[i], &codepointByteCount);
        int index = GetGlyphIndex(font, codepoint);

        // NOTE: Normally we exit the decoding sequence as soon as a bad byte is found (and return 0x3f)
        // but we need to draw all of the bad bytes using the '?' symbol moving one byte
        if (codepoint == 0x3f) codepointByteCount = 1;

        if (codepoint == '\n')
        {
            // NOTE: Fixed line spacing of 1.5 line-height
            // TODO: Support custom line spacing defined by user
            textOffsetY += (font.baseSize + font.baseSize/2);
            textOffsetX = 0;
        }
        else
        {
            if ((codepoint != ' ') && (codepoint != '\t'))
            {
                Rectangle rec = { (float)(textOffsetX + font.chars[index].offsetX), (float)(textOffsetY + font.chars[index].offsetY), (float)font.recs[index].width, (float)font.recs[index].height };
                ImageDraw(&imText, font.chars[index].image, (Rectangle){ 0, 0, (float)font.chars[index].image.width, (float)font.chars[index].image.height }, rec, tint);
            }

            if (font.chars[index].advanceX == 0) textOffsetX += (int)(font.recs[index].width + spacing);
            else textOffsetX += font.chars[index].advanceX + (int)spacing;
        }

        i += (codepointByteCount - 1);   // Move text bytes counter to next codepoint
    }

    // Scale image depending on text size
    if (fontSize > imSize.y)
    {
        float scaleFactor = fontSize/imSize.y;
        TRACELOG(LOG_INFO, "IMAGE: Text scaled by factor: %f", scaleFactor);

        // Using nearest-neighbor scaling algorithm for default font
        if (font.texture.id == GetFontDefault().texture.id) ImageResizeNN(&imText, (int)(imSize.x*scaleFactor), (int)(imSize.y*scaleFactor));
        else ImageResize(&imText, (int)(imSize.x*scaleFactor), (int)(imSize.y*scaleFactor));
    }

    return imText;
}